

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UChar * __thiscall
icu_63::Normalizer2Impl::getDecomposition
          (Normalizer2Impl *this,UChar32 c,UChar *buffer,int32_t *length)

{
  undefined2 uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int32_t iVar5;
  UChar *pUVar6;
  ushort *puVar7;
  int iVar8;
  
  if (c < (int)(uint)(ushort)this->minDecompNoCP) {
    pUVar6 = (UChar *)0x0;
  }
  else {
    uVar2 = getNorm16(this,c);
    if (uVar2 < this->minMaybeYes) {
      if (uVar2 < this->limitNoNo) {
        pUVar6 = (UChar *)0x0;
      }
      else {
        c = ((uint)(uVar2 >> 3) + c) - (uint)this->centerNoNoDelta;
        if ((uint)c < 0x10000) {
          iVar5 = 1;
          uVar3 = c;
        }
        else {
          uVar3 = ((uint)c >> 10) - 0x2840;
          buffer[1] = (ushort)c & 0x3ff | 0xdc00;
          iVar5 = 2;
        }
        *length = iVar5;
        *buffer = (UChar)uVar3;
        uVar2 = getRawNorm16(this,c);
        pUVar6 = buffer;
      }
      if (this->minYesNo <= uVar2) {
        if ((uVar2 == this->minYesNo) || (uVar1 = this->minYesNoMappingsOnly, (uVar1 | 1) == uVar2))
        {
          iVar4 = c - 0xac00;
          iVar8 = (int)((ulong)((long)iVar4 * -0x6db6db6d) >> 0x20) + c + -0xac00;
          iVar8 = (iVar8 >> 4) - (iVar8 >> 0x1f);
          *buffer = ((short)((ulong)((long)iVar4 * 0x6f74ae27) >> 0x28) - (short)(iVar4 >> 0x1f)) +
                    L'ᄀ';
          buffer[1] = (short)iVar8 + (short)(iVar8 / 0x15) * -0x15 + L'ᅡ';
          iVar4 = iVar4 + iVar8 * -0x1c;
          if (iVar4 == 0) {
            iVar5 = 2;
          }
          else {
            buffer[2] = (short)iVar4 + L'ᆧ';
            iVar5 = 3;
          }
          *length = iVar5;
          pUVar6 = buffer;
        }
        else {
          puVar7 = (ushort *)((long)this->extraData + (ulong)(uVar2 & 0xfffe));
          pUVar6 = (UChar *)(puVar7 + 1);
          *length = *puVar7 & 0x1f;
        }
      }
    }
    else {
      pUVar6 = (UChar *)0x0;
    }
  }
  return pUVar6;
}

Assistant:

const UChar *
Normalizer2Impl::getDecomposition(UChar32 c, UChar buffer[4], int32_t &length) const {
    uint16_t norm16;
    if(c<minDecompNoCP || isMaybeOrNonZeroCC(norm16=getNorm16(c))) {
        // c does not decompose
        return nullptr;
    }
    const UChar *decomp = nullptr;
    if(isDecompNoAlgorithmic(norm16)) {
        // Maps to an isCompYesAndZeroCC.
        c=mapAlgorithmic(c, norm16);
        decomp=buffer;
        length=0;
        U16_APPEND_UNSAFE(buffer, length, c);
        // The mapping might decompose further.
        norm16 = getRawNorm16(c);
    }
    if (norm16 < minYesNo) {
        return decomp;
    } else if(isHangulLV(norm16) || isHangulLVT(norm16)) {
        // Hangul syllable: decompose algorithmically
        length=Hangul::decompose(c, buffer);
        return buffer;
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    length=*mapping&MAPPING_LENGTH_MASK;
    return (const UChar *)mapping+1;
}